

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O2

ssize_t __thiscall DistanceGraph::write(DistanceGraph *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  ofstream *ofs;
  uint64_t s;
  
  ofs = (ofstream *)CONCAT44(in_register_00000034,__fd);
  s = (this->name)._M_string_length;
  std::ostream::write((char *)ofs,(long)&s);
  std::ostream::write((char *)ofs,(long)(this->name)._M_dataplus._M_p);
  sdglib::write_flat_vectorvector<Link>(ofs,&this->links);
  return extraout_RAX;
}

Assistant:

void DistanceGraph::write(std::ofstream &output_file) {
    uint64_t s=name.size();
    output_file.write((char *) &s,sizeof(s));
    output_file.write((char *)name.data(),name.size());
    sdglib::write_flat_vectorvector(output_file, links);
}